

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O0

void __thiscall
QNetworkAccessManager::QNetworkAccessManager(QNetworkAccessManager *this,QObject *parent)

{
  QNetworkAccessManagerPrivate *this_00;
  QObject *in_RSI;
  QObject *in_RDI;
  QNetworkAccessManagerPrivate *in_stack_ffffffffffffffd8;
  
  this_00 = (QNetworkAccessManagerPrivate *)operator_new(0x108);
  QNetworkAccessManagerPrivate::QNetworkAccessManagerPrivate(this_00);
  QObject::QObject(in_RDI,&this_00->super_QObjectPrivate,in_RSI);
  *(undefined ***)in_RDI = &PTR_metaObject_0049a180;
  ensureInitialized();
  d_func((QNetworkAccessManager *)0x19b289);
  QNetworkAccessManagerPrivate::ensureBackendPluginsLoaded(in_stack_ffffffffffffffd8);
  qRegisterMetaType<QNetworkReply::NetworkError>();
  qRegisterMetaType<QNetworkProxy>();
  qRegisterMetaType<QList<QSslError>>();
  qRegisterMetaType<QSslConfiguration>();
  qRegisterMetaType<QSslPreSharedKeyAuthenticator*>();
  qRegisterMetaType<QList<std::pair<QByteArray,QByteArray>>>();
  qRegisterMetaType<QHttpNetworkRequest>();
  qRegisterMetaType<QNetworkReply::NetworkError>();
  qRegisterMetaType<QSharedPointer<char>>();
  return;
}

Assistant:

QNetworkAccessManager::QNetworkAccessManager(QObject *parent)
    : QObject(*new QNetworkAccessManagerPrivate, parent)
{
    ensureInitialized();
    d_func()->ensureBackendPluginsLoaded();

    qRegisterMetaType<QNetworkReply::NetworkError>();
#ifndef QT_NO_NETWORKPROXY
    qRegisterMetaType<QNetworkProxy>();
#endif
#ifndef QT_NO_SSL
    qRegisterMetaType<QList<QSslError> >();
    qRegisterMetaType<QSslConfiguration>();
    qRegisterMetaType<QSslPreSharedKeyAuthenticator *>();
#endif
    qRegisterMetaType<QList<std::pair<QByteArray, QByteArray>>>();
#if QT_CONFIG(http)
    qRegisterMetaType<QHttpNetworkRequest>();
#endif
    qRegisterMetaType<QNetworkReply::NetworkError>();
    qRegisterMetaType<QSharedPointer<char> >();
}